

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall
helics::HandleManager::addEndpointAlias
          (HandleManager *this,string_view interfaceName,string_view alias)

{
  iterator iVar1;
  runtime_error *this_00;
  MapType *this_01;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  pVar2;
  int local_34;
  string_view alias_local;
  string_view interfaceName_local;
  
  alias_local._M_str = alias._M_str;
  alias_local._M_len = alias._M_len;
  interfaceName_local._M_str = interfaceName._M_str;
  interfaceName_local._M_len = interfaceName._M_len;
  this_01 = &this->endpoints;
  iVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_01->_M_h,&interfaceName_local);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_01->_M_h,&alias_local);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_34 = *(int *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                                ._M_cur + 0x18);
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,int>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_01,&interfaceName_local);
    }
  }
  else {
    local_34 = *(int *)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                              ._M_cur + 0x18);
    pVar2 = std::
            unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
            ::try_emplace<int>(this_01,&alias_local,&local_34);
    if ((((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (*(int *)((long)pVar2.first.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                + 0x18) !=
        *(int *)((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                       ._M_cur + 0x18))) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"endpoint name and alias already exists");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void HandleManager::addEndpointAlias(std::string_view interfaceName, std::string_view alias)
{
    auto fnd = endpoints.find(interfaceName);
    if (fnd != endpoints.end()) {
        auto res = endpoints.try_emplace(alias, fnd->second.baseValue());
        if (!res.second && res.first->second != fnd->second) {
            throw std::runtime_error("endpoint name and alias already exists");
        }
    } else {
        fnd = endpoints.find(alias);
        if (fnd != endpoints.end()) {
            endpoints.emplace(interfaceName, fnd->second.baseValue());
        }
    }
}